

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O0

bool __thiscall Employee::validate(Employee *this,string *id)

{
  char *pcVar1;
  string local_40 [32];
  string *local_20;
  string *id_local;
  Employee *this_local;
  
  local_20 = id;
  id_local = (string *)this;
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)id);
  if (*pcVar1 == '*') {
    std::__cxx11::string::string(local_40,(string *)id);
    this_local._7_1_ = Person::validate(&this->super_Person,(string *)local_40);
    std::__cxx11::string::~string(local_40);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Employee::validate(string id) {
    if (id[2] != '*')
        return false;
    return Person::validate(id);
}